

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O3

target_ulong helper_yield_mips64el(CPUMIPSState_conflict5 *env,target_ulong arg)

{
  uint uVar1;
  uintptr_t unaff_retaddr;
  
  if ((long)arg < 0) {
    if (((arg == 0xfffffffffffffffe) || (((uint)env->CP0_VPEControl >> 0x15 & 1) == 0)) ||
       (((env->active_tc).CP0_TCStatus & 0x100000) == 0)) goto LAB_009767f1;
    uVar1 = env->CP0_VPEControl & 0xfff8ffffU | 0x40000;
  }
  else {
    if (arg == 0) {
LAB_009767f1:
      return env->CP0_YQMask;
    }
    uVar1 = env->CP0_VPEControl & 0xfff8ffffU | 0x20000;
  }
  env->CP0_VPEControl = uVar1;
  do_raise_exception(env,0x1d,unaff_retaddr);
}

Assistant:

target_ulong helper_yield(CPUMIPSState *env, target_ulong arg)
{
    target_long arg1 = arg;

    if (arg1 < 0) {
        /* No scheduling policy implemented. */
        if (arg1 != -2) {
            if (env->CP0_VPEControl & (1 << CP0VPECo_YSI) &&
                env->active_tc.CP0_TCStatus & (1 << CP0TCSt_DT)) {
                env->CP0_VPEControl &= ~(0x7 << CP0VPECo_EXCPT);
                env->CP0_VPEControl |= 4 << CP0VPECo_EXCPT;
                do_raise_exception(env, EXCP_THREAD, GETPC());
            }
        }
    } else if (arg1 == 0) {
        if (0) {
            /* TODO: TC underflow */
            env->CP0_VPEControl &= ~(0x7 << CP0VPECo_EXCPT);
            do_raise_exception(env, EXCP_THREAD, GETPC());
        } else {
            /* TODO: Deallocate TC */
        }
    } else if (arg1 > 0) {
        /* Yield qualifier inputs not implemented. */
        env->CP0_VPEControl &= ~(0x7 << CP0VPECo_EXCPT);
        env->CP0_VPEControl |= 2 << CP0VPECo_EXCPT;
        do_raise_exception(env, EXCP_THREAD, GETPC());
    }
    return env->CP0_YQMask;
}